

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86.cpp
# Opt level: O3

int __thiscall
ncnn::MultiHeadAttention_x86::destroy_pipeline(MultiHeadAttention_x86 *this,Option *_opt)

{
  Layer *pLVar1;
  Option opt;
  undefined4 local_48;
  int iStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  int iStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  uint uStack_24;
  int iStack_20;
  undefined4 uStack_1c;
  int local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  local_48._0_1_ = _opt->lightmode;
  local_48._1_1_ = _opt->use_shader_pack8;
  local_48._2_1_ = _opt->use_subgroup_ops;
  local_48._3_1_ = _opt->use_reserved_0;
  iStack_44 = _opt->num_threads;
  uStack_40 = *(undefined4 *)&_opt->blob_allocator;
  uStack_3c = *(undefined4 *)((long)&_opt->blob_allocator + 4);
  local_38 = *(undefined4 *)&_opt->workspace_allocator;
  uStack_34 = *(undefined4 *)((long)&_opt->workspace_allocator + 4);
  iStack_30 = _opt->openmp_blocktime;
  uStack_2c._0_1_ = _opt->use_winograd_convolution;
  uStack_2c._1_1_ = _opt->use_sgemm_convolution;
  uStack_2c._2_1_ = _opt->use_int8_inference;
  uStack_2c._3_1_ = _opt->use_vulkan_compute;
  local_28._0_1_ = _opt->use_bf16_storage;
  local_28._1_1_ = _opt->use_fp16_packed;
  local_28._2_1_ = _opt->use_fp16_storage;
  local_28._3_1_ = _opt->use_fp16_arithmetic;
  uStack_24._0_1_ = _opt->use_int8_packed;
  uStack_24._1_1_ = _opt->use_int8_storage;
  uStack_24._2_1_ = _opt->use_int8_arithmetic;
  uStack_24._3_1_ = _opt->use_packing_layout;
  iStack_20 = _opt->vulkan_device_index;
  uStack_1c._0_1_ = _opt->use_reserved_1;
  uStack_1c._1_1_ = _opt->use_image_storage;
  uStack_1c._2_1_ = _opt->use_tensor_storage;
  uStack_1c._3_1_ = _opt->use_reserved_2;
  local_18 = _opt->flush_denormals;
  uStack_14._0_1_ = _opt->use_local_pool_allocator;
  uStack_14._1_1_ = _opt->use_shader_local_memory;
  uStack_14._2_1_ = _opt->use_cooperative_matrix;
  uStack_14._3_1_ = _opt->use_winograd23_convolution;
  uStack_10._0_1_ = _opt->use_winograd43_convolution;
  uStack_10._1_1_ = _opt->use_winograd63_convolution;
  uStack_10._2_1_ = _opt->use_a53_a55_optimized_kernel;
  uStack_10._3_1_ = _opt->use_fp16_uniform;
  uStack_c._0_1_ = _opt->use_int8_uniform;
  uStack_c._1_1_ = _opt->use_reserved_9;
  uStack_c._2_1_ = _opt->use_reserved_10;
  uStack_c._3_1_ = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    uStack_24 = uStack_24 & 0xffffff;
  }
  pLVar1 = this->qk_softmax;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->qk_softmax != (Layer *)0x0) {
      (*this->qk_softmax->_vptr_Layer[1])();
    }
    this->qk_softmax = (Layer *)0x0;
  }
  pLVar1 = this->q_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->q_gemm != (Layer *)0x0) {
      (*this->q_gemm->_vptr_Layer[1])();
    }
    this->q_gemm = (Layer *)0x0;
  }
  pLVar1 = this->k_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->k_gemm != (Layer *)0x0) {
      (*this->k_gemm->_vptr_Layer[1])();
    }
    this->k_gemm = (Layer *)0x0;
  }
  pLVar1 = this->v_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->v_gemm != (Layer *)0x0) {
      (*this->v_gemm->_vptr_Layer[1])();
    }
    this->v_gemm = (Layer *)0x0;
  }
  pLVar1 = this->o_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->o_gemm != (Layer *)0x0) {
      (*this->o_gemm->_vptr_Layer[1])();
    }
    this->o_gemm = (Layer *)0x0;
  }
  pLVar1 = this->qk_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->qk_gemm != (Layer *)0x0) {
      (*this->qk_gemm->_vptr_Layer[1])();
    }
    this->qk_gemm = (Layer *)0x0;
  }
  pLVar1 = this->qkv_gemm;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_48);
    if (this->qkv_gemm != (Layer *)0x0) {
      (*this->qkv_gemm->_vptr_Layer[1])();
    }
    this->qkv_gemm = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int MultiHeadAttention_x86::destroy_pipeline(const Option& _opt)
{
    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    if (qk_softmax)
    {
        qk_softmax->destroy_pipeline(opt);
        delete qk_softmax;
        qk_softmax = 0;
    }

    if (q_gemm)
    {
        q_gemm->destroy_pipeline(opt);
        delete q_gemm;
        q_gemm = 0;
    }

    if (k_gemm)
    {
        k_gemm->destroy_pipeline(opt);
        delete k_gemm;
        k_gemm = 0;
    }

    if (v_gemm)
    {
        v_gemm->destroy_pipeline(opt);
        delete v_gemm;
        v_gemm = 0;
    }

    if (o_gemm)
    {
        o_gemm->destroy_pipeline(opt);
        delete o_gemm;
        o_gemm = 0;
    }

    if (qk_gemm)
    {
        qk_gemm->destroy_pipeline(opt);
        delete qk_gemm;
        qk_gemm = 0;
    }
    if (qkv_gemm)
    {
        qkv_gemm->destroy_pipeline(opt);
        delete qkv_gemm;
        qkv_gemm = 0;
    }

    return 0;
}